

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void * __thiscall
google::protobuf::Reflection::MutableRawSplitImpl
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  char *pcVar1;
  bool bVar2;
  uint32_t uVar3;
  CppStringType CVar4;
  OneofDescriptor *pOVar5;
  void **ppvVar6;
  RepeatedPtrFieldBase *pRVar7;
  LogMessage *this_00;
  RepeatedPtrFieldBase *pRVar8;
  Arena *arena;
  string_view v;
  LogMessage LStack_38;
  
  pOVar5 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar5 == (OneofDescriptor *)0x0) {
    uVar3 = internal::ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,field);
    PrepareSplitMessageForWrite(this,message);
    ppvVar6 = MutableSplitField(this,message);
    bVar2 = FieldDescriptor::is_repeated(field);
    pRVar8 = (RepeatedPtrFieldBase *)((ulong)uVar3 + (long)*ppvVar6);
    pRVar7 = pRVar8;
    if (bVar2) {
      arena = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      pRVar7 = (RepeatedPtrFieldBase *)
               (((SooRep *)&pRVar8->tagged_rep_or_elem_)->field_0).long_rep.elements_int;
      if (pRVar7 == (RepeatedPtrFieldBase *)internal::kZeroBuffer) {
        if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) < 9) ||
           ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 9 &&
            (CVar4 = FieldDescriptor::cpp_string_type(field), CVar4 == kCord)))) {
          pRVar7 = (RepeatedPtrFieldBase *)
                   Arena::CreateArenaCompatible<google::protobuf::RepeatedField<int>>(arena);
        }
        else {
          pRVar7 = Arena::CreateArenaCompatible<google::protobuf::internal::RepeatedPtrFieldBase>
                             (arena);
        }
        (((SooRep *)&pRVar8->tagged_rep_or_elem_)->field_0).long_rep.elements_int =
             (uintptr_t)pRVar7;
      }
    }
    return pRVar7;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xb6c,"!schema_.InRealOneof(field)");
  this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&LStack_38,(char (*) [9])"Field = ");
  pcVar1 = (field->all_names_).payload_;
  v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
  v._M_str = pcVar1 + ~v._M_len;
  absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,v);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_38)
  ;
}

Assistant:

void* Reflection::MutableRawSplitImpl(Message* message,
                                      const FieldDescriptor* field) const {
  ABSL_DCHECK(!schema_.InRealOneof(field)) << "Field = " << field->full_name();

  const uint32_t field_offset = schema_.GetFieldOffsetNonOneof(field);
  PrepareSplitMessageForWrite(message);
  void** split = MutableSplitField(message);
  if (SplitFieldHasExtraIndirection(field)) {
    return AllocIfDefault(field,
                          *GetPointerAtOffset<void*>(*split, field_offset),
                          message->GetArena());
  }
  return GetPointerAtOffset<void>(*split, field_offset);
}